

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkTransferNames(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p)

{
  int iVar1;
  int i_00;
  int local_1c;
  int i;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  iVar1 = Wlc_NtkHasCopy(pNew);
  if (iVar1 == 0) {
    iVar1 = Wlc_NtkHasCopy(p);
    if (iVar1 != 0) {
      iVar1 = Wlc_NtkHasNameId(pNew);
      if (iVar1 == 0) {
        iVar1 = Wlc_NtkHasNameId(p);
        if (iVar1 != 0) {
          if ((pNew->pManName == (Abc_Nam_t *)0x0) && (p->pManName != (Abc_Nam_t *)0x0)) {
            Wlc_NtkCleanNameId(pNew);
            for (local_1c = 0; local_1c < p->nObjsAlloc; local_1c = local_1c + 1) {
              iVar1 = Wlc_ObjCopy(p,local_1c);
              if (0 < iVar1) {
                iVar1 = Vec_IntSize(&p->vNameIds);
                if (local_1c < iVar1) {
                  iVar1 = Wlc_ObjNameId(p,local_1c);
                  if (iVar1 != 0) {
                    iVar1 = Wlc_ObjCopy(p,local_1c);
                    i_00 = Wlc_ObjNameId(p,local_1c);
                    Wlc_ObjSetNameId(pNew,iVar1,i_00);
                  }
                }
              }
            }
            pNew->pManName = p->pManName;
            p->pManName = (Abc_Nam_t *)0x0;
            Vec_IntErase(&p->vNameIds);
            pNew->pMemTable = p->pMemTable;
            p->pMemTable = (Mem_Flex_t *)0x0;
            pNew->vTables = p->vTables;
            p->vTables = (Vec_Ptr_t *)0x0;
            return;
          }
          __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                        ,0x342,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
        }
      }
      __assert_fail("!Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                    ,0x341,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
    }
  }
  __assert_fail("!Wlc_NtkHasCopy(pNew) && Wlc_NtkHasCopy(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNtk.c"
                ,0x340,"void Wlc_NtkTransferNames(Wlc_Ntk_t *, Wlc_Ntk_t *)");
}

Assistant:

void Wlc_NtkTransferNames( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p )
{
    int i;
    assert( !Wlc_NtkHasCopy(pNew)   && Wlc_NtkHasCopy(p)   );
    assert( !Wlc_NtkHasNameId(pNew) && Wlc_NtkHasNameId(p) );
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    Wlc_NtkCleanNameId( pNew );
    for ( i = 0; i < p->nObjsAlloc; i++ )
        if ( Wlc_ObjCopy(p, i) > 0 && i < Vec_IntSize(&p->vNameIds) && Wlc_ObjNameId(p, i) )
            Wlc_ObjSetNameId( pNew, Wlc_ObjCopy(p, i), Wlc_ObjNameId(p, i) );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    Vec_IntErase( &p->vNameIds );
    // transfer table
    pNew->pMemTable = p->pMemTable;  p->pMemTable = NULL;
    pNew->vTables = p->vTables;      p->vTables = NULL;
}